

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_link_errors
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  LayoutBindingProgram *this_00;
  String *this_01;
  allocator<char> local_32b;
  allocator<char> local_32a;
  allocator<char> local_329;
  String local_328;
  String local_308;
  String local_2e8;
  string local_2c8 [32];
  String local_2a8;
  String local_288;
  String local_268;
  String local_248;
  String local_228;
  String decl;
  String local_1e8;
  String local_1c8;
  StringStream s;
  undefined4 extraout_var_03;
  
  if ((this->m_stage).type == VertexShader) {
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,*(char **)CONCAT44(extraout_var,iVar2),(allocator<char> *)&local_1c8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])(&local_328,this,1);
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,*(char **)(CONCAT44(extraout_var_00,iVar2) + 0x18),
               (allocator<char> *)&local_1e8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_2a8,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_288,this,&local_2a8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_2c8,this,0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"float",&local_32b);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_228,this,local_2c8,&local_248);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_268,this,0);
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    local_2e8._M_string_length = 0;
    local_2e8.field_2._M_local_buf[0] = '\0';
    buildUniformDecl(&decl,this,(String *)&s,&local_328,&local_308,&local_288,&local_228,&local_268,
                     &local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&s);
    setTemplateParam(this,VertexShader,"UNIFORM_DECL",&decl);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"fragColor =",(allocator<char> *)&local_328);
    setTemplateParam(this,VertexShader,"OUT_ASSIGNMENT",(String *)&s);
    std::__cxx11::string::~string((string *)&s);
    StringStream::StringStream(&s);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_308,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
              (&local_328,this,&local_308);
    poVar3 = std::operator<<((ostream *)&s,(string *)&local_328);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::stringbuf::str();
    setTemplateParam(this,VertexShader,"UNIFORM_ACCESS",&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    updateTemplate(this,VertexShader);
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,*(char **)CONCAT44(extraout_var_01,iVar2),&local_32b);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])(&local_288,this,3);
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,*(char **)(CONCAT44(extraout_var_02,iVar2) + 0x18),&local_329);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_2c8,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_228,this,local_2c8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_268,this,0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"float",&local_32a);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_248,this,&local_268,&local_2e8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_1c8,this,0);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    buildUniformDecl(&local_328,this,&local_308,&local_288,&local_2a8,&local_228,&local_248,
                     &local_1c8,&local_1e8);
    std::__cxx11::string::operator=((string *)&decl,(string *)&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_308);
    setTemplateParam(this,FragmentShader,"UNIFORM_DECL",&decl);
    StringStream::reset(&s);
    poVar3 = std::operator<<((ostream *)&s,"fragColor + ");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_308,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
              (&local_328,this,&local_308);
    poVar3 = std::operator<<(poVar3,(string *)&local_328);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::stringbuf::str();
    setTemplateParam(this,FragmentShader,"UNIFORM_ACCESS",&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    updateTemplate(this,FragmentShader);
    iVar2 = (*(this->super_IProgramContextSupplier)._vptr_IProgramContextSupplier[6])
                      (&this->super_IProgramContextSupplier);
    this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_03,iVar2);
    bVar1 = LayoutBindingProgram::compiledAndLinked(this_00);
    if (bVar1) {
      LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_328,this_00,true);
      __return_storage_ptr__->m_passed = false;
      __return_storage_ptr__->m_notRunForThisContext = false;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)&local_328)
      ;
      std::__cxx11::string::~string((string *)&local_328);
      (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
      StringStream::~StringStream(&s);
      this_01 = &decl;
      goto LAB_00bee7d7;
    }
    (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
    StringStream::~StringStream(&s);
    std::__cxx11::string::~string((string *)&decl);
  }
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
  LayoutBindingTestResult::LayoutBindingTestResult(__return_storage_ptr__,true,(String *)&s,false);
  this_01 = (String *)&s;
LAB_00bee7d7:
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_link_errors(void)
{
	bool passed = true;

	// same sampler with different binding in two compilation units
	if (isStage(VertexShader))
	{
		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(1),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam(VertexShader, "UNIFORM_DECL", decl);

		setTemplateParam(VertexShader, "OUT_ASSIGNMENT", String("fragColor ="));

		StringStream s;
		s << buildAccess(getDefaultUniformName()) << ";\n";
		setTemplateParam(VertexShader, "UNIFORM_ACCESS", s.str());
		updateTemplate(VertexShader);

		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(3),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam(FragmentShader, "UNIFORM_DECL", decl);

		s.reset();
		s << "fragColor + " << buildAccess(getDefaultUniformName()) << ";\n";
		setTemplateParam(FragmentShader, "UNIFORM_ACCESS", s.str());
		updateTemplate(FragmentShader);

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed = !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}

	return LayoutBindingTestResult(passed, String());
}